

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any.hpp
# Opt level: O0

int __thiscall
chaiscript::detail::Any::Data_Impl<std::shared_ptr<const_unsigned_long_long>_>::clone
          (Data_Impl<std::shared_ptr<const_unsigned_long_long>_> *this,__fn *__fn,
          void *__child_stack,int __flags,void *__arg,...)

{
  pointer in_stack_ffffffffffffff98;
  int iVar1;
  Data_Impl<std::shared_ptr<const_unsigned_long_long>_> *t_type;
  
  t_type = this;
  operator_new(0x20);
  std::shared_ptr<const_unsigned_long_long>::shared_ptr
            ((shared_ptr<const_unsigned_long_long> *)this,
             (shared_ptr<const_unsigned_long_long> *)in_stack_ffffffffffffff98);
  Data_Impl((Data_Impl<std::shared_ptr<const_unsigned_long_long>_> *)__fn,
            (shared_ptr<const_unsigned_long_long> *)t_type);
  iVar1 = (int)t_type;
  std::unique_ptr<chaiscript::detail::Any::Data,std::default_delete<chaiscript::detail::Any::Data>>
  ::unique_ptr<std::default_delete<chaiscript::detail::Any::Data>,void>
            ((unique_ptr<chaiscript::detail::Any::Data,_std::default_delete<chaiscript::detail::Any::Data>_>
              *)this,in_stack_ffffffffffffff98);
  std::shared_ptr<const_unsigned_long_long>::~shared_ptr
            ((shared_ptr<const_unsigned_long_long> *)0x242585);
  return iVar1;
}

Assistant:

std::unique_ptr<Data> clone() const CHAISCRIPT_OVERRIDE
            {
              return std::unique_ptr<Data>(new Data_Impl<T>(m_data));
            }